

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Minisat::Clause::Clause(Clause *this,vec<Minisat::Lit,_int> *ps,bool use_extra,bool learnt)

{
  uint uVar1;
  Lit *pLVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  Clause CVar7;
  undefined7 in_register_00000011;
  int i;
  long lVar8;
  
  iVar3 = (int)CONCAT71(in_register_00000011,use_extra);
  iVar4 = (int)CONCAT71(in_register_00000009,learnt);
  this->header = (anon_struct_4_5_613047fb_for_header)
                 (((uint)this->header & 0xffffffe0) + iVar3 * 8 + iVar4 * 4);
  uVar1 = ps->sz;
  this->header = (anon_struct_4_5_613047fb_for_header)(uVar1 * 0x20 + iVar3 * 8 + iVar4 * 4);
  pLVar2 = ps->data;
  for (lVar8 = 0; lVar8 < ps->sz; lVar8 = lVar8 + 1) {
    this[lVar8 + 1].header = *(anon_struct_4_5_613047fb_for_header *)(pLVar2 + lVar8);
  }
  if (use_extra) {
    if (!learnt) {
      if (((uint)this->header & 8) == 0) {
        __assert_fail("header.has_extra",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/SolverTypes.h"
                      ,0xbc,"void Minisat::Clause::calcAbstraction()");
      }
      uVar5 = (ulong)((uint)this->header >> 5);
      CVar7.header = (anon_struct_4_5_613047fb_for_header)0x0;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        CVar7.header = CVar7.header | 1 << (*(byte *)&this[uVar6 + 1].header >> 1 & 0x1f);
      }
      this[uVar5 + 1].header = CVar7.header;
      return;
    }
    this[(ulong)(uVar1 & 0x7ffffff) + 1].header = (anon_struct_4_5_613047fb_for_header)0x0;
  }
  return;
}

Assistant:

Clause(const vec<Lit>& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();

        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];

        if (header.has_extra){
            if (header.learnt)
                data[header.size].act = 0;
            else
                calcAbstraction();
    }
    }